

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

int Abc_AigCheck(Abc_Aig_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *p1;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t **ppAVar12;
  int i;
  
  iVar10 = 0;
  while( true ) {
    pNtk = pMan->pNtkAig;
    iVar3 = pNtk->vObjs->nSize;
    if (iVar3 <= iVar10) break;
    pAVar4 = Abc_NtkObj(pNtk,iVar10);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      iVar3 = (pAVar4->vFanins).nSize;
      if (iVar3 == 0) {
        iVar3 = Abc_AigNodeIsConst(pAVar4);
        if (iVar3 == 0) {
          pcVar5 = "Abc_AigCheck: The AIG has non-standard constant nodes.";
          goto LAB_00693e57;
        }
      }
      else {
        if (iVar3 == 1) {
          pcVar5 = "Abc_AigCheck: The AIG has single input nodes.";
          goto LAB_00693e57;
        }
        if (2 < iVar3) {
          pcVar5 = "Abc_AigCheck: The AIG has non-standard nodes.";
          goto LAB_00693e57;
        }
        piVar1 = (pAVar4->vFanins).pArray;
        ppvVar2 = pAVar4->pNtk->vObjs->pArray;
        uVar11 = *(uint *)((long)ppvVar2[*piVar1] + 0x14) >> 0xc;
        uVar7 = *(uint *)((long)ppvVar2[piVar1[1]] + 0x14) >> 0xc;
        if (uVar7 < uVar11) {
          uVar7 = uVar11;
        }
        if (*(uint *)&pAVar4->field_0x14 >> 0xc != uVar7 + 1) {
          pcVar5 = Abc_ObjName(pAVar4);
          printf("Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n",
                 pcVar5);
        }
        pAVar6 = Abc_ObjChild0(pAVar4);
        p1 = Abc_ObjChild1(pAVar4);
        pAVar6 = Abc_AigAndLookup(pMan,pAVar6,p1);
        if (pAVar6 != pAVar4) {
          Abc_ObjName(pAVar4);
          printf("Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n");
        }
      }
    }
    iVar10 = iVar10 + 1;
  }
  uVar9 = 0;
  uVar8 = (ulong)(uint)pMan->nBins;
  if (pMan->nBins < 1) {
    uVar8 = uVar9;
  }
  iVar10 = 0;
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (ppAVar12 = pMan->pBins + uVar9; *ppAVar12 != (Abc_Obj_t *)0x0;
        ppAVar12 = &(*ppAVar12)->pNext) {
      iVar10 = iVar10 + 1;
    }
  }
  if (iVar10 == pNtk->nObjCounts[7]) {
    iVar10 = 1;
    for (i = 0; i < iVar3; i = i + 1) {
      pAVar4 = Abc_NtkObj(pNtk,i);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        if (((ulong)pAVar4 & 1) != 0) {
          pcVar5 = "!Abc_ObjIsComplement(pNode)";
LAB_00693e7f:
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (pAVar4->pNtk->ntkType != ABC_NTK_STRASH) {
          pcVar5 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_00693e7f;
        }
        if (((pAVar4->field_5).pData != (void *)0x0) &&
           (pAVar6 = pAVar4, 0 < (pAVar4->vFanouts).nSize)) {
          while (pAVar6 = (Abc_Obj_t *)(pAVar6->field_5).pData, pAVar6 != (Abc_Obj_t *)0x0) {
            if (0 < (pAVar6->vFanouts).nSize) {
              pcVar5 = Abc_ObjName(pAVar6);
              printf("Abc_AigCheck: Representative %s",pcVar5);
              pcVar5 = Abc_ObjName(pAVar4);
              printf(" of choice node %s has %d fanouts.\n",pcVar5,
                     (ulong)(uint)(pAVar6->vFanouts).nSize);
              return 0;
            }
          }
        }
      }
      pNtk = pMan->pNtkAig;
      iVar3 = pNtk->vObjs->nSize;
    }
  }
  else {
    pcVar5 = "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.";
LAB_00693e57:
    puts(pcVar5);
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Abc_AigCheck( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pObj, * pAnd;
    int i, nFanins, Counter;
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
    {
        nFanins = Abc_ObjFaninNum(pObj);
        if ( nFanins == 0 )
        {
            if ( !Abc_AigNodeIsConst(pObj) )
            {
                printf( "Abc_AigCheck: The AIG has non-standard constant nodes.\n" );
                return 0;
            }
            continue;
        }
        if ( nFanins == 1 )
        {
            printf( "Abc_AigCheck: The AIG has single input nodes.\n" );
            return 0;
        }
        if ( nFanins > 2 )
        {
            printf( "Abc_AigCheck: The AIG has non-standard nodes.\n" );
            return 0;
        }
        if ( pObj->Level != 1 + (unsigned)Abc_MaxInt( Abc_ObjFanin0(pObj)->Level, Abc_ObjFanin1(pObj)->Level ) )
            printf( "Abc_AigCheck: Node \"%s\" has level that does not agree with the fanin levels.\n", Abc_ObjName(pObj) );
        pAnd = Abc_AigAndLookup( pMan, Abc_ObjChild0(pObj), Abc_ObjChild1(pObj) );
        if ( pAnd != pObj )
            printf( "Abc_AigCheck: Node \"%s\" is not in the structural hashing table.\n", Abc_ObjName(pObj) );
    }
    // count the number of nodes in the table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            Counter++;
    if ( Counter != Abc_NtkNodeNum(pMan->pNtkAig) )
    {
        printf( "Abc_AigCheck: The number of nodes in the structural hashing table is wrong.\n" );
        return 0;
    }
    // if the node is a choice node, nodes in its class should not have fanouts
    Abc_NtkForEachNode( pMan->pNtkAig, pObj, i )
        if ( Abc_AigNodeIsChoice(pObj) )
            for ( pAnd = (Abc_Obj_t *)pObj->pData; pAnd; pAnd = (Abc_Obj_t *)pAnd->pData )
                if ( Abc_ObjFanoutNum(pAnd) > 0 )
                {
                    printf( "Abc_AigCheck: Representative %s", Abc_ObjName(pAnd) );
                    printf( " of choice node %s has %d fanouts.\n", Abc_ObjName(pObj), Abc_ObjFanoutNum(pAnd) );
                    return 0;
                }
    return 1;
}